

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int sintf1_(int *n,int *inc,double *x,double *wsave,double *xh,double *work,int *ier)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  double *pdVar11;
  uint uVar12;
  double dVar13;
  double dVar14;
  int lnxh;
  int np1;
  int *local_68;
  double *local_60;
  ulong local_58;
  double *local_50;
  double *local_48;
  int lnsv;
  int lnwk;
  int ier1;
  
  iVar3 = *inc;
  uVar5 = (ulong)iVar3;
  *ier = 0;
  uVar1 = *n;
  uVar10 = (ulong)uVar1;
  if (1 < (int)uVar1) {
    uVar8 = ~uVar5;
    local_60 = x + uVar8;
    if (uVar1 == 2) {
      dVar13 = *x;
      iVar3 = iVar3 * 2 + 1;
      dVar14 = local_60[iVar3];
      local_60[iVar3] = (dVar13 - dVar14) * 0.5773502691896258;
      *x = (dVar13 + dVar14) * 0.5773502691896258;
    }
    else {
      local_50 = wsave + -1;
      uVar4 = uVar1 + 1;
      uVar12 = uVar1 >> 1;
      pdVar11 = local_60 + 1;
      lVar6 = uVar10 * uVar5 + uVar8 + 1;
      lVar7 = uVar5 + 1 + uVar8;
      for (lVar9 = 1; lVar9 - (ulong)(uVar1 >> 1) != 1; lVar9 = lVar9 + 1) {
        dVar14 = x[lVar7] - x[lVar6];
        dVar13 = (x[lVar7] + x[lVar6]) * wsave[lVar9 + -1];
        xh[lVar9] = dVar14 + dVar13;
        xh[uVar10] = dVar13 - dVar14;
        uVar10 = uVar10 - 1;
        lVar6 = lVar6 - uVar5;
        lVar7 = lVar7 + uVar5;
      }
      if ((uVar1 & 1) != 0) {
        xh[(ulong)uVar12 + 1] = local_60[(long)(int)((uVar12 + 1) * iVar3) + 1] * 4.0;
      }
      local_58 = (ulong)uVar12;
      *xh = 0.0;
      lnxh = uVar4;
      np1 = uVar4;
      local_68 = n;
      local_48 = work;
      dVar13 = log((double)(int)uVar4);
      lnsv = (int)(dVar13 / 0.6931471805599453) + uVar1 + 5;
      lnwk = uVar4;
      rfft1f_(&np1,&c__1,xh,&lnxh,local_50 + local_58 + 1,&lnsv,local_48,&lnwk,&ier1);
      if (ier1 == 0) {
        if ((uVar1 & 1) != 0) {
          xh[(ulong)uVar4 - 1] = xh[(ulong)uVar4 - 1] + xh[(ulong)uVar4 - 1];
        }
        dVar13 = *xh * 0.5;
        *x = dVar13;
        iVar2 = *local_68;
        for (lVar7 = 3; lVar7 <= iVar2; lVar7 = lVar7 + 2) {
          pdVar11[uVar5 * 2] = xh[lVar7 + -1] * 0.5;
          dVar13 = dVar13 + xh[lVar7 + -2] * 0.5;
          pdVar11[uVar5 * 3] = dVar13;
          pdVar11 = pdVar11 + uVar5 * 2;
        }
        if ((uVar1 & 1) == 0) {
          local_60[(long)(iVar3 * iVar2) + 1] = xh[iVar2] * 0.5;
        }
      }
      else {
        *ier = 0x14;
      }
    }
  }
  return 0;
}

Assistant:

int sintf1_(int *n, int *inc, fft_real_t *x, fft_real_t *wsave,
	fft_real_t *xh, fft_real_t *work, int *ier)
{
    /* System generated locals */
    int x_dim1, x_offset, i__1;

    /* Builtin functions */

    /* Local variables */
     int i__, k;
     fft_real_t t1, t2;
     int kc, np1, ns2, ier1, modn;
     fft_real_t dsum;
     int lnxh, lnwk, lnsv;
     fft_real_t sfnp1, xhold;
    extern /* Subroutine */ int rfft1f_(int *, int *, fft_real_t *, int
	    *, fft_real_t *, int *, fft_real_t *, int *, int *);
     fft_real_t ssqrt3;
    extern /* Subroutine */ int xerfft_(char *, int *, ftnlen);

    /* Parameter adjustments */
    x_dim1 = *inc;
    x_offset = 1 + x_dim1;
    x -= x_offset;
    --wsave;
    --xh;

    /* Function Body */
    *ier = 0;
    if ((i__1 = *n - 2) < 0) {
	goto L200;
    } else if (i__1 == 0) {
	goto L102;
    } else {
	goto L103;
    }
L102:
    ssqrt3 = 1.0 / sqrt(3.0);
    xhold = ssqrt3 * (x[x_dim1 + 1] + x[(x_dim1 << 1) + 1]);
    x[(x_dim1 << 1) + 1] = ssqrt3 * (x[x_dim1 + 1] - x[(x_dim1 << 1) + 1]);
    x[x_dim1 + 1] = xhold;
    goto L200;
L103:
    np1 = *n + 1;
    ns2 = *n / 2;
    i__1 = ns2;
    for (k = 1; k <= i__1; ++k) {
	kc = np1 - k;
	t1 = x[k * x_dim1 + 1] - x[kc * x_dim1 + 1];
	t2 = wsave[k] * (x[k * x_dim1 + 1] + x[kc * x_dim1 + 1]);
	xh[k + 1] = t1 + t2;
	xh[kc + 1] = t2 - t1;
/* L104: */
    }
    modn = *n % 2;
    if (modn == 0) {
	goto L124;
    }
    xh[ns2 + 2] = x[(ns2 + 1) * x_dim1 + 1] * 4.0;
L124:
    xh[1] = 0.0;
    lnxh = np1;
    lnsv = np1 + (int) (log((fft_real_t) np1) / log(2.0)) + 4;
    lnwk = np1;

    rfft1f_(&np1, &c__1, &xh[1], &lnxh, &wsave[ns2 + 1], &lnsv, work, &lnwk, &
	    ier1);
    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("SINTF1", &c_n5, (ftnlen)6);
	goto L200;
    }

    if (np1 % 2 != 0) {
	goto L30;
    }
    xh[np1] += xh[np1];
L30:
    sfnp1 = 1.0 / (fft_real_t) np1;
    x[x_dim1 + 1] = xh[1] * .5;
    dsum = x[x_dim1 + 1];
    i__1 = *n;
    for (i__ = 3; i__ <= i__1; i__ += 2) {
	x[(i__ - 1) * x_dim1 + 1] = xh[i__] * .5;
	dsum += xh[i__ - 1] * .5;
	x[i__ * x_dim1 + 1] = dsum;
/* L105: */
    }
    if (modn != 0) {
	goto L200;
    }
    x[*n * x_dim1 + 1] = xh[*n + 1] * .5;
L200:
    return 0;
}